

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.c
# Opt level: O0

void spi_mode_enable(void)

{
  undefined1 local_12 [2];
  int ret;
  uint8_t buf [10];
  
  memset(local_12,0,10);
  write(i2s_fd,local_12,10);
  usleep(1000);
  write(i2s_fd,local_12,10);
  usleep(1000);
  write(i2s_fd,local_12,10);
  usleep(1000);
  return;
}

Assistant:

static void spi_mode_enable(void)
{
	uint8_t buf[10] ={0x00};
	int ret =0;
	ret = write(i2s_fd,buf,10);
	usleep(1000);
	ret = write(i2s_fd,buf,10);
	usleep(1000);
	ret = write(i2s_fd,buf,10);
	usleep(1000);
	if(ret ==0)
	  ret++;
	else
	  ret =0;
}